

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error_code.hpp
# Opt level: O0

string_ref * __thiscall
system_error2::_std_error_code_domain::_do_message
          (string_ref *__return_storage_ptr__,_std_error_code_domain *this,status_code<void> *code)

{
  int __v;
  bool bVar1;
  status_code_domain *this_00;
  value_type *pvVar2;
  error_category *__cat;
  _error_code_type c_00;
  error_code local_38;
  std_error_code *local_28;
  std_error_code *c;
  status_code<void> *code_local;
  _std_error_code_domain *this_local;
  
  c = (std_error_code *)code;
  code_local = (status_code<void> *)this;
  this_local = (_std_error_code_domain *)__return_storage_ptr__;
  this_00 = status_code<void>::domain(code);
  bVar1 = status_code_domain::operator==(this_00,&this->super_status_code_domain);
  if (!bVar1) {
    __assert_fail("code.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/std_error_code.hpp"
                  ,0x126,
                  "virtual _std_error_code_domain::string_ref system_error2::_std_error_code_domain::_do_message(const status_code<void> &) const"
                 );
  }
  local_28 = c;
  pvVar2 = detail::status_code_storage<system_error2::_std_error_code_domain>::value
                     ((status_code_storage<system_error2::_std_error_code_domain> *)c);
  __v = *pvVar2;
  __cat = mixins::
          mixin<system_error2::detail::status_code_storage<system_error2::_std_error_code_domain>,_system_error2::_std_error_code_domain>
          ::category(&local_28->
                      super_mixin<system_error2::detail::status_code_storage<system_error2::_std_error_code_domain>,_system_error2::_std_error_code_domain>
                    );
  std::error_code::error_code(&local_38,__v,__cat);
  c_00._4_4_ = 0;
  c_00._M_value = local_38._M_value;
  c_00._M_cat = local_38._M_cat;
  _make_string_ref(__return_storage_ptr__,c_00);
  return __return_storage_ptr__;
}

Assistant:

inline _std_error_code_domain::string_ref _std_error_code_domain::_do_message(const status_code<void> &code) const noexcept
{
  assert(code.domain() == *this);
  const auto &c = static_cast<const std_error_code &>(code);  // NOLINT
  return _make_string_ref(_error_code_type(c.value(), c.category()));
}